

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# range_map_test.cc
# Opt level: O0

void __thiscall
bloaty::RangeMapTest::AssertRollupEquals
          (RangeMapTest *this,
          vector<const_bloaty::RangeMap_*,_std::allocator<const_bloaty::RangeMap_*>_> *maps,
          vector<bloaty::RangeMapTest::Row,_std::allocator<bloaty::RangeMapTest::Row>_> *rows)

{
  bool bVar1;
  AssertHelper *this_00;
  vector<bloaty::RangeMapTest::Row,_std::allocator<bloaty::RangeMapTest::Row>_> *in_RDX;
  AssertHelper *in_RSI;
  AssertionResult gtest_ar;
  int i;
  vector<const_bloaty::RangeMap_*,_std::allocator<const_bloaty::RangeMap_*>_> *in_stack_00000300;
  anon_class_16_2_d7075cc7 in_stack_00000308;
  int *in_stack_ffffffffffffff70;
  char *rhs_expression;
  AssertionResult *this_01;
  int line;
  undefined4 in_stack_ffffffffffffff90;
  undefined4 uVar2;
  undefined4 in_stack_ffffffffffffff94;
  Type in_stack_ffffffffffffff9c;
  AssertHelper *in_stack_ffffffffffffffa0;
  AssertionResult local_40;
  char *local_30;
  char local_1c [4];
  AssertHelper *this_02;
  
  local_1c[0] = '\0';
  local_1c[1] = '\0';
  local_1c[2] = '\0';
  local_1c[3] = '\0';
  rhs_expression = local_1c;
  local_30 = rhs_expression;
  this_02 = in_RSI;
  RangeMap::
  ComputeRollup<bloaty::RangeMapTest::AssertRollupEquals(std::vector<bloaty::RangeMap_const*,std::allocator<bloaty::RangeMap_const*>>,std::vector<bloaty::RangeMapTest::Row,std::allocator<bloaty::RangeMapTest::Row>>const&)::_lambda(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,unsigned_long,unsigned_long)_1_>
            (in_stack_00000300,in_stack_00000308);
  std::vector<bloaty::RangeMapTest::Row,_std::allocator<bloaty::RangeMapTest::Row>_>::size(in_RDX);
  this_01 = &local_40;
  testing::internal::EqHelper::Compare<unsigned_long,_int,_nullptr>
            (&this_01->success_,rhs_expression,(unsigned_long *)in_RSI,in_stack_ffffffffffffff70);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(this_01);
  line = (int)((ulong)this_01 >> 0x20);
  uVar2 = CONCAT13(bVar1,(int3)in_stack_ffffffffffffff90);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_ffffffffffffffa0);
    this_00 = (AssertHelper *)testing::AssertionResult::failure_message((AssertionResult *)0x181c50)
    ;
    testing::internal::AssertHelper::AssertHelper
              (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c,
               (char *)CONCAT44(in_stack_ffffffffffffff94,uVar2),line,rhs_expression);
    testing::internal::AssertHelper::operator=(this_02,(Message *)in_RDX);
    testing::internal::AssertHelper::~AssertHelper(this_00);
    testing::Message::~Message((Message *)0x181c9e);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x181cee);
  return;
}

Assistant:

void AssertRollupEquals(const std::vector<const RangeMap*> maps,
                          const std::vector<Row>& rows) {
    int i = 0;
    RangeMap::ComputeRollup(
        maps, [&i, &rows](const std::vector<std::string>& keys, uint64_t start,
                          uint64_t end) {
          ASSERT_LT(i, rows.size());
          const auto& row = rows[i];
          ASSERT_EQ(row.keys, keys);
          ASSERT_EQ(row.start, start);
          ASSERT_EQ(row.end, end);
          i++;
        });
    ASSERT_EQ(rows.size(), i);
  }